

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
ElementsTransactionApi_EstimateFee_MinimumValue_Test::TestBody
          (ElementsTransactionApi_EstimateFee_MinimumValue_Test *this)

{
  Txid *this_00;
  Script *this_01;
  pointer puVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  char *pcVar5;
  Amount *utxo_fee_00;
  Amount AVar6;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l;
  initializer_list<cfd::UtxoData> __l_00;
  AssertionResult gtest_ar_;
  undefined1 local_11c0 [16];
  Privkey local_11b0;
  ElementsTransactionApi api;
  uint32_t minimum_fee;
  undefined4 uStack_1184;
  undefined1 local_1178 [16];
  ByteData local_1168;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  Amount local_1138;
  string tx_hex;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  Amount tx_fee;
  Amount utxo_fee;
  Pubkey local_10d0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  SigHashType local_1084;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1068 [78];
  undefined8 local_b88;
  Script local_b80;
  uint32_t local_b48;
  ElementsAddressFactory factory;
  ConfidentialTransactionContext txc;
  ElementsUtxoAndOption eutxo1;
  UtxoData utxo1;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kElementsRegtest);
  tx_hex._M_dataplus._M_p = (pointer)&tx_hex.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tx_hex,
             "02000000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c8000000000000"
             ,"");
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  gtest_ar._0_8_ = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::Txid::Txid((Txid *)&eutxo1,(string *)&gtest_ar);
  this_00 = &utxo1.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)&eutxo1);
  eutxo1.utxo.block_height = (uint64_t)&PTR__Txid_00723450;
  if ((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                       eutxo1.utxo.block_hash._vptr_BlockHash._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                                     eutxo1.utxo.block_hash._vptr_BlockHash._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  utxo1.vout = 0;
  gtest_ar._0_8_ = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b","");
  cfd::core::Script::Script((Script *)&eutxo1,(string *)&gtest_ar);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&eutxo1);
  cfd::core::Script::~Script((Script *)&eutxo1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar._0_8_ = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"ert1qav7q64dhpx9y4m62rrhpa67trmvjf2ptxfddld","");
  cfd::AddressFactory::GetAddress
            ((Address *)&eutxo1,&factory.super_AddressFactory,(string *)&gtest_ar);
  cfd::core::Address::operator=(&utxo1.address,(Address *)&eutxo1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&eutxo1.utxo.address.script_tree_.super_TapBranch.script_);
  cfd::core::Script::~Script((Script *)&eutxo1.utxo.address.pubkey_);
  eutxo1.utxo.locking_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &eutxo1.utxo.address.hash_);
  cfd::core::TapBranch::~TapBranch
            ((TapBranch *)
             ((long)&eutxo1.utxo.locking_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data + 8));
  if (eutxo1.utxo.locking_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(eutxo1.utxo.locking_script.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if (eutxo1.utxo._72_8_ != 0) {
    operator_delete((void *)eutxo1.utxo._72_8_);
  }
  if (eutxo1.utxo.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(eutxo1.utxo.txid.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      eutxo1.utxo.block_hash.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer *)
      ((long)&eutxo1.utxo.block_hash.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10U)) {
    operator_delete(eutxo1.utxo.block_hash.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&utxo1.descriptor,0,(char *)utxo1.descriptor._M_string_length,0x57ce89);
  cfd::core::Amount::Amount((Amount *)&eutxo1,0x5f5e1c8);
  utxo1.amount.ignore_check_ = (bool)eutxo1.utxo.block_hash._vptr_BlockHash._0_1_;
  utxo1.amount.amount_ = eutxo1.utxo.block_height;
  utxo1.address_type = kP2wpkhAddress;
  gtest_ar._0_8_ = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&eutxo1,(string *)&gtest_ar);
  cfd::core::ConfidentialAssetId::operator=(&utxo1.asset,(ConfidentialAssetId *)&eutxo1);
  eutxo1.utxo.block_height = (uint64_t)&PTR__ConfidentialAssetId_00723760;
  if ((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                       eutxo1.utxo.block_hash._vptr_BlockHash._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                                     eutxo1.utxo.block_hash._vptr_BlockHash._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar._0_8_ = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"ebfecaae1665f32a3843ce65c42fb6e3f51136fa9d37274b810887923ae89339",
             "");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&eutxo1,(string *)&gtest_ar);
  cfd::core::BlindFactor::operator=(&utxo1.asset_blind_factor,(BlindFactor *)&eutxo1);
  eutxo1.utxo.block_height = (uint64_t)&PTR__BlindFactor_00723500;
  if ((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                       eutxo1.utxo.block_hash._vptr_BlockHash._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                                     eutxo1.utxo.block_hash._vptr_BlockHash._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar._0_8_ = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"80af7bd339db43ad22c1fa9109eea6d617c8b87b91c4bde2b5fafcbb1902211a",
             "");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&eutxo1,(string *)&gtest_ar);
  cfd::core::BlindFactor::operator=(&utxo1.amount_blind_factor,(BlindFactor *)&eutxo1);
  eutxo1.utxo.block_height = (uint64_t)&PTR__BlindFactor_00723500;
  if ((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                       eutxo1.utxo.block_hash._vptr_BlockHash._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                                     eutxo1.utxo.block_hash._vptr_BlockHash._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar._0_8_ = local_1068;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,
             "085e6338f9da8a7f754b8e2726894e04bee997c8ada526f3215de8bc151aa063d3","");
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&eutxo1,(string *)&gtest_ar);
  cfd::core::ConfidentialValue::operator=(&utxo1.value_commitment,(ConfidentialValue *)&eutxo1);
  eutxo1.utxo.block_height = (uint64_t)&PTR__ConfidentialValue_00723840;
  if ((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                       eutxo1.utxo.block_hash._vptr_BlockHash._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(eutxo1.utxo.block_hash._vptr_BlockHash._1_7_,
                                     eutxo1.utxo.block_hash._vptr_BlockHash._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  cfd::UtxoData::UtxoData(&eutxo1.utxo);
  this_01 = &eutxo1.claim_script;
  eutxo1.is_issuance = false;
  eutxo1.is_blind_issuance = false;
  eutxo1.is_pegin = false;
  eutxo1.pegin_btc_tx_size = 0;
  cfd::core::Script::Script(this_01);
  eutxo1.pegin_txoutproof_size = 0;
  cfd::UtxoData::operator=(&eutxo1.utxo,&utxo1);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&eutxo1.utxo);
  local_b88._2_1_ = eutxo1.is_pegin;
  local_b88._0_1_ = eutxo1.is_issuance;
  local_b88._1_1_ = eutxo1.is_blind_issuance;
  local_b88._3_1_ = eutxo1._1267_1_;
  local_b88._4_4_ = eutxo1.pegin_btc_tx_size;
  cfd::core::Script::Script(&local_b80,this_01);
  local_b48 = eutxo1.pegin_txoutproof_size;
  __l._M_len = 1;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector(&utxos_and_options,__l,(allocator_type *)&txc);
  cfd::core::Script::~Script(&local_b80);
  cfd::UtxoData::~UtxoData((UtxoData *)&gtest_ar);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,&tx_hex);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l_00,(allocator_type *)&gtest_ar_);
  cfd::UtxoData::~UtxoData((UtxoData *)&gtest_ar);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xec,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (((gtest_ar._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  cfd::core::Amount::Amount(&local_1138);
  cfd::core::Amount::Amount(&utxo_fee);
  cfd::core::Amount::Amount(&tx_fee);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&gtest_ar,(AbstractTransaction *)&txc)
  ;
  utxo_fee_00 = &utxo_fee;
  AVar6 = cfd::api::ElementsTransactionApi::EstimateFee
                    (&api,(string *)&gtest_ar,&utxos_and_options,&utxo1.asset,&tx_fee,utxo_fee_00,
                     true,0.1,0,0x24,(uint32_t *)0x0);
  local_1138.amount_ = AVar6.amount_;
  local_1138.ignore_check_ = AVar6.ignore_check_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_1068) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_1138);
  local_11b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 99;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"calc_fee.GetSatoshiValue()","99",(long *)&gtest_ar_,
             (int *)&local_11b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_11b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_11b0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_11b0);
    if (((gtest_ar_._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&tx_fee);
  local_11b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x5c;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"tx_fee.GetSatoshiValue()","92",(long *)&gtest_ar_,
             (int *)&local_11b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_11b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_11b0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_11b0);
    if (((gtest_ar_._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&utxo_fee);
  local_11b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"utxo_fee.GetSatoshiValue()","7",(long *)&gtest_ar_,
             (int *)&local_11b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_11b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xf9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_11b0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_11b0);
    if (((gtest_ar_._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      utxo_fee_00 = (Amount *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                (&txc,&ct_addrs,1,0,0x24,
                 (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xfc,
               "Expected: txc.Blind(&ct_addrs, 1, 0, 36) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (((gtest_ar._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  cfd::core::ConfidentialTransaction::GetTxOutList(&txouts,&txc.super_ConfidentialTransaction);
  gtest_ar_._0_8_ =
       ((long)txouts.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)txouts.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
  local_11b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"txouts.size()","2",(unsigned_long *)&gtest_ar_,
             (int *)&local_11b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_11b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xfe,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_11b0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_11b0);
    if (((gtest_ar_._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)txouts.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)txouts.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x1f0) goto LAB_0024ca16;
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,
             &(txouts.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start)->confidential_value_);
  bVar2 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)&gtest_ar);
  gtest_ar_.success_ = bVar2;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar._0_8_ = &PTR__ConfidentialValue_00723840;
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (!bVar2) goto LAB_0024c84d;
  }
  else {
    operator_delete(gtest_ar.message_.ptr_);
    if ((gtest_ar_._0_8_ & 1) == 0) {
LAB_0024c84d:
      testing::Message::Message((Message *)&local_11b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)utxo_fee_00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&minimum_fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x100,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&minimum_fee,(Message *)&local_11b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minimum_fee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != local_1068) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (((CONCAT44(local_11b0.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     local_11b0.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((long *)CONCAT44(local_11b0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_11b0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_11b0.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_11b0.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,
             &txouts.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start[1].confidential_value_);
  bVar2 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)&gtest_ar);
  gtest_ar_.success_ = !bVar2;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar._0_8_ = &PTR__ConfidentialValue_00723840;
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar2) goto LAB_0024c965;
  }
  else {
    operator_delete(gtest_ar.message_.ptr_);
    if ((gtest_ar_._0_8_ & 1) == 0) {
LAB_0024c965:
      testing::Message::Message((Message *)&local_11b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","true","false",
                 (char *)utxo_fee_00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&minimum_fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x101,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&minimum_fee,(Message *)&local_11b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minimum_fee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != local_1068) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (((CONCAT44(local_11b0.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     local_11b0.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((long *)CONCAT44(local_11b0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_11b0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_11b0.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_11b0.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
LAB_0024ca16:
  cfd::core::ByteData::ByteData(&local_1168);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      gtest_ar_._0_8_ = local_11c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar_,
                 "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6","");
      cfd::core::Pubkey::Pubkey(&local_10d0,(string *)&gtest_ar_);
      _minimum_fee = (pointer)local_1178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&minimum_fee,"cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1","");
      cfd::core::Privkey::FromWif(&local_11b0,(string *)&minimum_fee,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1084);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,&local_10d0,&local_11b0,&local_1084,true);
      if ((void *)CONCAT44(local_11b0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_11b0.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_11b0.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_11b0.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if ((AssertHelperData *)_minimum_fee != (AssertHelperData *)local_1178) {
        operator_delete(_minimum_fee);
      }
      if (local_10d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_10d0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)gtest_ar_._0_8_ != local_11c0) {
        operator_delete((void *)gtest_ar_._0_8_);
      }
      gtest_ar._0_8_ = &PTR__Txid_00723450;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x109,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6\"), Privkey::FromWif( \"cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (((gtest_ar._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      cfd::ConfidentialTransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      gtest_ar._0_8_ = &PTR__Txid_00723450;
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(gtest_ar.message_.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x10a,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (((gtest_ar._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
      puVar1 = local_1168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_1168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)gtest_ar._0_8_;
      local_1168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar.message_.ptr_;
      local_1168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1068[0]._0_8_;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1068[0]._M_allocated_capacity = 0;
      if ((puVar1 != (pointer)0x0) && (operator_delete(puVar1), gtest_ar._0_8_ != 0)) {
        operator_delete((void *)gtest_ar._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x10c,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (((gtest_ar._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  sVar4 = cfd::core::ByteData::GetDataSize(&local_1168);
  if (((sVar4 != 0xcdf) && (sVar4 = cfd::core::ByteData::GetDataSize(&local_1168), sVar4 != 0xcde))
     && (sVar4 = cfd::core::ByteData::GetDataSize(&local_1168), sVar4 != 0xce0)) {
    gtest_ar_._0_8_ = cfd::core::ByteData::GetDataSize(&local_1168);
    local_11b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"tx.GetDataSize()","0",(unsigned_long *)&gtest_ar_,
               (int *)&local_11b0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_11b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x10f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_11b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_11b0);
      if (((gtest_ar_._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&txc.super_ConfidentialTransaction);
  if ((uVar3 != 0x3dc) &&
     (uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&txc.super_ConfidentialTransaction),
     uVar3 != 0x3db)) {
    uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&txc.super_ConfidentialTransaction);
    gtest_ar_._0_4_ = uVar3;
    local_11b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x3dc;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar,"txc.GetVsize()","988",(uint *)&gtest_ar_,(int *)&local_11b0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_11b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x113,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_11b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_11b0);
      if (((gtest_ar_._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&txc.super_ConfidentialTransaction);
  minimum_fee = (uVar3 * 100) / 1000;
  if (uVar3 * 100 - 99000 < 0xfffff830) {
    gtest_ar_._0_4_ = 0x62;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar,"minimum_fee","98",&minimum_fee,(int *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_11b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x118,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_11b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_11b0);
      if (((gtest_ar_._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (local_1168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1168.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&ct_addrs);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&utxos_and_options);
  cfd::core::Script::~Script(this_01);
  cfd::UtxoData::~UtxoData(&eutxo1.utxo);
  cfd::UtxoData::~UtxoData(&utxo1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tx_hex._M_dataplus._M_p != &tx_hex.field_2) {
    operator_delete(tx_hex._M_dataplus._M_p);
  }
  factory.super_AddressFactory._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&factory.super_AddressFactory.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_MinimumValue)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string tx_hex = "02000000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000c8000000000000";

  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ert1qav7q64dhpx9y4m62rrhpa67trmvjf2ptxfddld");
  utxo1.descriptor = "wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)";
  utxo1.amount = Amount(int64_t{100000200});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  utxo1.asset_blind_factor = BlindFactor("ebfecaae1665f32a3843ce65c42fb6e3f51136fa9d37274b810887923ae89339");
  utxo1.amount_blind_factor = BlindFactor("80af7bd339db43ad22c1fa9109eea6d617c8b87b91c4bde2b5fafcbb1902211a");
  utxo1.value_commitment = ConfidentialValue("085e6338f9da8a7f754b8e2726894e04bee997c8ada526f3215de8bc151aa063d3");
  ElementsUtxoAndOption eutxo1;
  eutxo1.utxo = utxo1;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1
  };

  ConfidentialTransactionContext txc(tx_hex);

  std::vector<cfd::UtxoData> utxos{utxo1};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 0.1;
  uint64_t effective_fee_rate2 = 100;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate, 0, 36);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 99);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 92);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 7);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  EXPECT_NO_THROW(txc.Blind(&ct_addrs, 1, 0, 36));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 2);
  if (txouts.size() == 2) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[1].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6"),
      Privkey::FromWif(
          "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 3295) && (tx.GetDataSize() != 3294) && (tx.GetDataSize() != 3296)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 988) && (txc.GetVsize() != 987)) {
    EXPECT_EQ(txc.GetVsize(), 988);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate2) / 1000;
  if ((minimum_fee != 98) && (minimum_fee != 97)) {
    EXPECT_EQ(minimum_fee, 98);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}